

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_write(anm_archive_t *anm,char *filename)

{
  short sVar1;
  long *plVar2;
  char *pcVar3;
  uint *puVar4;
  ulong *buffer;
  ulong uVar5;
  FILE *__stream;
  uint uVar6;
  FILE *__stream_00;
  long offset;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  int *piVar11;
  char *pcVar12;
  long *plVar13;
  long *plVar14;
  uint uVar15;
  size_t size;
  long *plVar16;
  short *buffer_00;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  list_node_t *plVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  size_t sStack_70;
  anm_instr0_t new_instr;
  undefined4 uStack_5c;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  pcVar3 = argv0;
  if (__stream_00 == (FILE *)0x0) {
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar3,filename,pcVar12);
    exit(1);
  }
  plVar20 = (list_node_t *)&anm->entries;
  do {
    plVar20 = plVar20->next;
    if (plVar20 == (list_node_t *)0x0) {
      fclose(__stream_00);
      return;
    }
    plVar2 = (long *)plVar20->data;
    offset = file_tell((FILE *)__stream_00);
    sVar7 = strlen((char *)plVar2[2]);
    plVar16 = plVar2 + 4;
    uVar15 = 0;
    uVar18 = 0xffffffff;
    plVar13 = plVar16;
    do {
      uVar17 = (ulong)uVar15;
      plVar13 = (long *)*plVar13;
      uVar18 = uVar18 + 1;
      uVar15 = uVar15 + 1;
    } while (plVar13 != (long *)0x0);
    plVar13 = plVar2 + 6;
    uVar15 = 0xffffffff;
    plVar14 = plVar13;
    do {
      plVar14 = (long *)*plVar14;
      uVar15 = uVar15 + 1;
    } while (plVar14 != (long *)0x0);
    file_seek((FILE *)__stream_00,(ulong)uVar18 * 4 + offset + (ulong)uVar15 * 8 + 0x40);
    lVar8 = file_tell((FILE *)__stream_00);
    iVar19 = (int)offset;
    *(int *)(*plVar2 + 0x1c) = (int)lVar8 - iVar19;
    pcVar3 = (char *)plVar2[2];
    sVar9 = strlen(pcVar3);
    file_write((FILE *)__stream_00,pcVar3,sVar9);
    file_write((FILE *)__stream_00,"",0x10 - (ulong)((uint)sVar7 & 0xf));
    if (((char *)plVar2[3] != (char *)0x0) && (*(int *)(*plVar2 + 0x28) == 0)) {
      sVar7 = strlen((char *)plVar2[3]);
      lVar8 = file_tell((FILE *)__stream_00);
      *(int *)(*plVar2 + 0x24) = (int)lVar8 - iVar19;
      pcVar3 = (char *)plVar2[3];
      sVar9 = strlen(pcVar3);
      file_write((FILE *)__stream_00,pcVar3,sVar9);
      file_write((FILE *)__stream_00,"",0x10 - (ulong)((uint)sVar7 & 0xf));
    }
    lVar8 = file_tell((FILE *)__stream_00);
    while (plVar16 = (long *)*plVar16, plVar14 = plVar13, plVar16 != (long *)0x0) {
      file_write((FILE *)__stream_00,(void *)plVar16[2],0x14);
    }
    while (plVar14 = (long *)*plVar14, plVar14 != (long *)0x0) {
      plVar16 = (long *)plVar14[2];
      lVar10 = file_tell((FILE *)__stream_00);
      *(int *)(*plVar16 + 4) = (int)lVar10 - iVar19;
      plVar16 = plVar16 + 1;
LAB_001064c3:
      while (uVar5 = _new_instr, plVar16 = (long *)*plVar16, plVar16 != (long *)0x0) {
        buffer_00 = (short *)plVar16[2];
        if (*(int *)(*plVar2 + 0x28) == 0) goto LAB_001064f0;
        if (*buffer_00 != -1) {
          sVar1 = buffer_00[1];
          buffer_00[1] = sVar1 + 8U;
          size = (size_t)(ushort)(sVar1 + 8U);
          goto LAB_00106524;
        }
        buffer_00[1] = 0;
        file_write((FILE *)__stream_00,buffer_00,8);
      }
      if (*(int *)(*plVar2 + 0x28) == 0) {
        _new_instr = _new_instr & 0xffffffff00000000;
        sStack_70 = 4;
      }
      else {
        _new_instr = 0xffff;
        sStack_70 = 8;
      }
      file_write((FILE *)__stream_00,&new_instr,sStack_70);
    }
    if (*(short *)(*plVar2 + 0x34) != 0) {
      lVar10 = file_tell((FILE *)__stream_00);
      *(int *)(*plVar2 + 0x30) = (int)lVar10 - iVar19;
      file_write((FILE *)__stream_00,(void *)plVar2[1],0x10);
      file_write((FILE *)__stream_00,(void *)plVar2[8],(ulong)*(uint *)(plVar2[1] + 0xc));
    }
    if (plVar20->next == (list_node_t *)0x0) {
      uVar6 = 0;
    }
    else {
      lVar10 = file_tell((FILE *)__stream_00);
      uVar6 = (int)lVar10 - iVar19;
    }
    puVar4 = (uint *)*plVar2;
    puVar4[0xe] = uVar6;
    *puVar4 = uVar18;
    puVar4[1] = uVar15;
    file_seek((FILE *)__stream_00,offset);
    buffer = (ulong *)*plVar2;
    uVar5 = buffer[5];
    if ((uint)uVar5 < 7) {
      file_write((FILE *)__stream_00,buffer,0x40);
    }
    else {
      buffer[7] = 0;
      buffer[5] = 0;
      buffer[6] = 0;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *buffer;
      auVar22 = pshuflw(auVar22,auVar22,0xe8);
      *(int *)((long)buffer + 4) = auVar22._0_4_;
      *(undefined2 *)(buffer + 1) = 0;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)buffer + 0xc);
      auVar22 = pshuflw(auVar23,auVar23,0xe8);
      *(int *)((long)buffer + 10) = auVar22._0_4_;
      *(undefined2 *)((long)buffer + 0xe) = *(undefined2 *)((long)buffer + 0x14);
      *(undefined4 *)(buffer + 2) = *(undefined4 *)((long)buffer + 0x1c);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = buffer[4];
      auVar22 = pshuflw(auVar24,auVar24,0xe8);
      *(int *)((long)buffer + 0x14) = auVar22._0_4_;
      *(uint *)buffer = (uint)uVar5;
      buffer[3] = *(ulong *)((long)buffer + 0x2c);
      buffer[4] = *(ulong *)((long)buffer + 0x34);
      file_write((FILE *)__stream_00,(void *)*plVar2,0x40);
      convert_header_to_old((anm_header06_t *)*plVar2);
    }
    iVar19 = (int)lVar8 - iVar19;
    while (bVar21 = uVar17 != 0, uVar17 = uVar17 - 1, bVar21) {
      _new_instr = CONCAT44(uStack_5c,iVar19);
      file_write((FILE *)__stream_00,&new_instr,4);
      iVar19 = iVar19 + 0x14;
    }
    while (plVar13 = (long *)*plVar13, plVar13 != (long *)0x0) {
      file_write((FILE *)__stream_00,*(void **)plVar13[2],8);
    }
    file_seek((FILE *)__stream_00,offset + (ulong)*(uint *)(*plVar2 + 0x38));
  } while( true );
LAB_001064f0:
  uStack_5c = SUB84(uVar5,4);
  new_instr = (anm_instr0_t)
              CONCAT13((uint8_t)buffer_00[1],(BADTYPE)CONCAT12((uint8_t)*buffer_00,buffer_00[2]));
  file_write((FILE *)__stream_00,&new_instr,4);
  size = _new_instr >> 0x18 & 0xff;
  if (size != 0) {
    buffer_00 = buffer_00 + 4;
LAB_00106524:
    file_write((FILE *)__stream_00,buffer_00,size);
  }
  goto LAB_001064c3;
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, sizeof(*sprite));

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (entry->header->version == 0) {
                anm_instr0_t sentinel = { 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            } else {
                anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);
            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * sizeof(sprite_t);
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}